

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O2

void __thiscall punky::lex::Lexer::skip_whitespace(Lexer *this)

{
  bool bVar1;
  
  while( true ) {
    bVar1 = utils::is_whitespace(this->m_curr_char);
    if (!bVar1) break;
    consume(this);
  }
  return;
}

Assistant:

void Lexer::skip_whitespace()
{
    while (utils::is_whitespace(m_curr_char))
        consume();
}